

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall QScrollerPrivate::setState(QScrollerPrivate *this,State newstate)

{
  QDebug this_00;
  State SVar1;
  qreal qVar2;
  bool bVar3;
  QDebug *pQVar4;
  char *t;
  QListSpecialMethodsBase<QScroller*> *this_01;
  Type *this_02;
  QScrollerPrivate *this_03;
  long in_FS_OFFSET;
  undefined1 local_80 [16];
  QScroller *q;
  QObject local_68;
  undefined3 uStack_67;
  undefined4 uStack_64;
  QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
  QStack_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  _func_int **pp_Stack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 *local_38;
  qreal local_30;
  
  local_30 = *(qreal *)(in_FS_OFFSET + 0x28);
  q = this->q_ptr;
  if (this->state == newstate) goto LAB_005daa72;
  this_03 = this;
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_68 = (QObject)0x2;
    uStack_67 = 0;
    uStack_64 = 0;
    QStack_60.d = (QScrollerPropertiesPrivate *)0x0;
    uStack_58 = 0;
    uStack_54 = 0;
    pp_Stack_50 = (_func_int **)lcScroller::category.name;
    this_03 = (QScrollerPrivate *)local_80;
    QMessageLogger::debug();
    this_00.stream = (Stream *)(local_80 + 8);
    ::operator<<(this_00,(QObject *)this_03);
    pQVar4 = QDebug::operator<<((QDebug *)this_00.stream,"QScroller::setState(");
    t = stateName(newstate);
    pQVar4 = QDebug::operator<<(pQVar4,t);
    QDebug::operator<<(pQVar4,')');
    QDebug::~QDebug((QDebug *)this_00.stream);
    QDebug::~QDebug((QDebug *)this_03);
  }
  switch(newstate) {
  case Inactive:
    this_03 = (QScrollerPrivate *)this->scrollTimer;
    QAbstractAnimation::stop();
    this->state = Inactive;
    (this->releaseVelocity).xp = 0.0;
    (this->releaseVelocity).yp = 0.0;
    if (this->firstScroll == false) {
      this_03 = (QScrollerPrivate *)&stack0xffffffffffffff98;
      local_68 = (QObject)0xaa;
      uStack_67 = 0xaaaaaa;
      uStack_64 = 0xaaaaaaaa;
      QStack_60.d = (QScrollerPropertiesPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      uStack_58 = 0xffffffff;
      uStack_54 = 0xffffffff;
      pp_Stack_50 = (_func_int **)0xffffffffffffffff;
      local_48 = 0xffffffff;
      uStack_44 = 0xffffffff;
      uStack_40 = 0xffffffff;
      uStack_3c = 0xffffffff;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      QScrollEvent::QScrollEvent
                ((QScrollEvent *)this_03,&this->contentPosition,&this->overshootPosition,
                 ScrollFinished);
      qt_sendSpontaneousEvent(this->target,(QEvent *)this_03);
      this->firstScroll = true;
      QScrollEvent::~QScrollEvent((QScrollEvent *)this_03);
    }
    break;
  case Pressed:
    this_03 = (QScrollerPrivate *)this->scrollTimer;
    QAbstractAnimation::stop();
    qVar2 = (this->releaseVelocity).yp;
    (this->oldVelocity).xp = (this->releaseVelocity).xp;
    (this->oldVelocity).yp = qVar2;
    (this->releaseVelocity).xp = 0.0;
    (this->releaseVelocity).yp = 0.0;
  default:
    this->state = newstate;
    break;
  case Dragging:
    (this->dragDistance).xp = 0.0;
    (this->dragDistance).yp = 0.0;
    SVar1 = this->state;
    this->state = Dragging;
    if (SVar1 == Pressed) goto LAB_005da9e9;
    break;
  case Scrolling:
    this->state = Scrolling;
LAB_005da9e9:
    this_03 = (QScrollerPrivate *)this->scrollTimer;
    QScrollTimer::start((QScrollTimer *)this_03);
  }
  SVar1 = this->state;
  this_01 = (QListSpecialMethodsBase<QScroller*> *)
            QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
            ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                          *)this_03);
  if ((SVar1 & ~Pressed) == Dragging) {
    bVar3 = QListSpecialMethodsBase<QScroller*>::contains<QScroller*>(this_01,&q);
    if (!bVar3) {
      this_02 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
                              *)this_01);
      QList<QScroller_*>::append(this_02,q);
    }
  }
  else {
    QtPrivate::sequential_erase_one<QList<QScroller*>,QScroller*>((QList<QScroller_*> *)this_01,&q);
  }
  QScroller::stateChanged(q,this->state);
LAB_005daa72:
  if (*(qreal *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::setState(QScroller::State newstate)
{
    Q_Q(QScroller);
    bool sendLastScroll = false;
    bool startTimer = false;

    if (state == newstate)
        return;

    qCDebug(lcScroller) << q << "QScroller::setState(" << stateName(newstate) << ')';

    switch (newstate) {
    case QScroller::Inactive:
#if QT_CONFIG(animation)
        scrollTimer->stop();
#endif

        // send the last scroll event (but only after the current state change was finished)
        if (!firstScroll)
            sendLastScroll = true;

        releaseVelocity = QPointF(0, 0);
        break;

    case QScroller::Pressed:
#if QT_CONFIG(animation)
        scrollTimer->stop();
#endif

        oldVelocity = releaseVelocity;
        releaseVelocity = QPointF(0, 0);
        break;

    case QScroller::Dragging:
        dragDistance = QPointF(0, 0);
#if QT_CONFIG(animation)
        if (state == QScroller::Pressed)
            startTimer = true;
#endif
        break;

    case QScroller::Scrolling:
#if QT_CONFIG(animation)
        startTimer = true;
#endif
        break;
    }

    qSwap(state, newstate);

#if QT_CONFIG(animation)
    // Only start the timer after the state has been changed
    if (startTimer)
        scrollTimer->start();
#endif
    if (sendLastScroll) {
        QScrollEvent se(contentPosition, overshootPosition, QScrollEvent::ScrollFinished);
        sendEvent(target, &se);
        firstScroll = true;
    }
    if (state == QScroller::Dragging || state == QScroller::Scrolling) {
        if (!qt_activeScrollers()->contains(q))
            qt_activeScrollers()->push_back(q);
    } else {
        qt_activeScrollers()->removeOne(q);
    }
    emit q->stateChanged(state);
}